

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

treeNode * identifiderExp(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  treeNode *ptVar5;
  treeNode *ptVar6;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  ptVar5 = (treeNode *)operator_new(0x58);
  paVar1 = &(ptVar5->text).field_2;
  (ptVar5->lineNo).row = 0;
  (ptVar5->lineNo).col = 0;
  ptVar5->nodeKind = statement;
  ptVar5->kind = (Kind)0x0;
  ptVar5->child[0] = (treeNode *)0x0;
  ptVar5->child[1] = (treeNode *)0x0;
  ptVar5->child[2] = (treeNode *)0x0;
  ptVar5->sibling = (treeNode *)0x0;
  (ptVar5->text)._M_dataplus._M_p = (pointer)paVar1;
  (ptVar5->text)._M_string_length = 0;
  (ptVar5->text).field_2._M_local_buf[0] = '\0';
  ptVar5->attrKind = Text;
  ptVar5->nodeKind = expression;
  ptVar5->kind = (Kind)0x3;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"++","");
  bVar3 = match(&local_48,Empty);
  bVar4 = true;
  if (!bVar3) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"--","");
    bVar4 = match(&local_88,Empty);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar4 != false) {
    ptVar6 = (treeNode *)operator_new(0x58);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,preToken.text._M_dataplus._M_p,
               preToken.text._M_dataplus._M_p + preToken.text._M_string_length);
    treeNode::treeNode(ptVar6,opExp,&local_a8);
    ptVar5->child[0] = ptVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  ptVar6 = identifider();
  ptVar5->child[1] = ptVar6;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"++","");
  bVar3 = match(&local_68,Empty);
  bVar4 = true;
  if (!bVar3) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--","");
    bVar4 = match(&local_c8,Empty);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (bVar4 != false) {
    ptVar6 = (treeNode *)operator_new(0x58);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,preToken.text._M_dataplus._M_p,
               preToken.text._M_dataplus._M_p + preToken.text._M_string_length);
    treeNode::treeNode(ptVar6,opExp,&local_e8);
    ptVar5->child[2] = ptVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  if ((ptVar5->child[0] == (treeNode *)0x0) && (ptVar5->child[2] == (treeNode *)0x0)) {
    ptVar6 = ptVar5->child[1];
    pcVar2 = (ptVar5->text)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2);
    }
    operator_delete(ptVar5);
    ptVar5 = ptVar6;
  }
  return ptVar5;
}

Assistant:

treeNode* identifiderExp()
{
    treeNode* ret=new treeNode(NodeKind::expression);
    if(match("++")||match("--"))
    {
        ret->child[0]=new treeNode(ExpKind::opExp,preToken.text);
    }
    ret->child[1]=identifider();
    if(match("++")||match("--"))
    {
        ret->child[2]=new treeNode(ExpKind::opExp,preToken.text);
    }

    if(ret->child[0]==nullptr&&ret->child[2]==nullptr)
    {
        auto tmp = ret->child[1];
        delete ret;
        return tmp;
    }
    else
        return ret;
}